

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O1

void __thiscall amrex::MLMG::computeResWithCrseCorFineCor(MLMG *this,int falev)

{
  pointer pVVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 local_2c;
  int local_24;
  
  local_2c = 0;
  local_24 = 0;
  if (this->cf_strategy == ghostnodes) {
    local_24 = (*this->linop->_vptr_MLLinOp[6])(this->linop,falev,0);
    local_2c = CONCAT44(local_24,local_24);
  }
  pVVar1 = (this->cor).
           super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
           .
           super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = *(undefined8 *)
           &(this->res).
            super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
            .
            super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[falev].
            super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
            super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>;
  uVar3 = *(undefined8 *)
           &(this->rescor).
            super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
            .
            super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[falev].
            super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
            super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>;
  (*this->linop->_vptr_MLLinOp[0x35])
            (this->linop,falev,0,uVar3,
             *(undefined8 *)
              &pVVar1[falev].super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>,uVar2,1,
             *(undefined8 *)
              &pVVar1[(long)falev + -1].super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>);
  (*this->linop->_vptr_MLLinOp[0x2c])(this->linop,uVar2,uVar3,&local_2c);
  return;
}

Assistant:

void
MLMG::computeResWithCrseCorFineCor (int falev)
{
    BL_PROFILE("MLMG::computeResWithCrseCorFineCor()");

    IntVect nghost(0);
    if (cf_strategy == CFStrategy::ghostnodes) nghost = IntVect(linop.getNGrow(falev));

    const Any& crse_cor = cor[falev-1][0];

    Any& fine_cor    = cor   [falev][0];
    Any& fine_res    = res   [falev][0];
    Any& fine_rescor = rescor[falev][0];

    // fine_rescor = fine_res - L(fine_cor)
    linop.AnyCorrectionResidual(falev, 0, fine_rescor, fine_cor, fine_res,
                                BCMode::Inhomogeneous, &crse_cor);
    linop.AnyCopy(fine_res, fine_rescor, nghost);
}